

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prs_check_spec(prscxdef *ctx,prsndef *expr)

{
  uint uVar1;
  errcxdef *ctx_00;
  prscxdef *in_RSI;
  int i;
  char *in_stack_ffffffffffffffd8;
  errcxdef *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  if (*(int *)((long)&in_RSI->prscxerr + 4) == 0) {
    if (*(int *)&in_RSI->prscxtok == 0x38) {
      uVar1 = (uint)(byte)in_RSI->prscxcps;
      if (uVar1 == 3) {
        *(undefined1 *)&in_RSI->prscxcps = 0xe;
      }
      else if ((uVar1 == 6) || (uVar1 - 9 < 2)) {
        errsigf(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
      }
    }
    else if (*(int *)&in_RSI->prscxtok == 0x35) {
      errsigf(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
    }
  }
  else {
    ctx_00 = (errcxdef *)(ulong)(*(int *)&in_RSI->prscxerr - 0x32);
    switch(ctx_00) {
    case (errcxdef *)0x0:
    case (errcxdef *)0x1:
    case (errcxdef *)0x2c:
    case (errcxdef *)0x2d:
    case (errcxdef *)0x64:
    case (errcxdef *)0x65:
    case (errcxdef *)0x66:
    case (errcxdef *)0x67:
    case (errcxdef *)0x68:
    case (errcxdef *)0x69:
    case (errcxdef *)0x6a:
    case (errcxdef *)0x6b:
    case (errcxdef *)0x6c:
    case (errcxdef *)0x6d:
    case (errcxdef *)0x6e:
    case (errcxdef *)0x6f:
    case (errcxdef *)0x70:
    case (errcxdef *)0x71:
    case (errcxdef *)0x72:
      errsigf(ctx_00,in_stack_ffffffffffffffd8,0);
    default:
      break;
    case (errcxdef *)0xe:
      if (*(int *)((long)&in_RSI->prscxerr + 4) == 3) {
        errsigf(ctx_00,in_stack_ffffffffffffffd8,0);
      }
      *(undefined4 *)&in_RSI->prscxerr = 0x1f;
    }
    for (iVar2 = 0; iVar2 < *(int *)((long)&in_RSI->prscxerr + 4); iVar2 = iVar2 + 1) {
      prs_check_spec(in_RSI,(prsndef *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

static void prs_check_spec(prscxdef *ctx, prsndef *expr)
{
    int i;
    
    /* 
     *   check the type of this node - if it's an assignment or a function
     *   call, prohibit it 
     */
    if (expr->prsnnlf == 0)
    {
        /* value node - check for a symbol */
        if (expr->prsnv.prsnvt.toktyp == TOKTSYMBOL)
        {
            switch(expr->prsnv.prsnvt.toksym.tokstyp)
            {
            case TOKSTPROP:
                /* 
                 *   convert this to a speculative evaluation property, so
                 *   that the emitter knows to emit the correct opcode for
                 *   it 
                 */
                expr->prsnv.prsnvt.toksym.tokstyp = TOKSTPROPSPEC;
                break;

            case TOKSTBIFN:
            case TOKSTINHERIT:
            case TOKSTEXTERN:
                /* don't allow calls */
                errsig(ctx->prscxerr, ERR_BADSPECEXPR);

            default:
                /* others are okay */
                break;
            }
        }
        else if (expr->prsnv.prsnvt.toktyp == TOKTDSTRING)
        {
            /* don't allow double-quoted strings in speculative evaluation */
            errsig(ctx->prscxerr, ERR_BADSPECEXPR);
        }
    }
    else
    {
        switch(expr->prsntyp)
        {
        case TOKTINC:
        case TOKTDEC:
        case TOKTPOSTINC:
        case TOKTPOSTDEC:
        case TOKTNEW:
        case TOKTDELETE:
        case TOKTLPAR:
        case TOKTASSIGN:
        case TOKTPLEQ:
        case TOKTMINEQ:
        case TOKTDIVEQ:
        case TOKTMODEQ:
        case TOKTTIMEQ:
        case TOKTBANDEQ:
        case TOKTBOREQ:
        case TOKTXOREQ:
        case TOKTSHLEQ:
        case TOKTSHREQ:
        case TOKTRPAR:
            /* assignments and function calls are all prohibited */
            errsig(ctx->prscxerr, ERR_BADSPECEXPR);
            
        case TOKTDOT:
            /* property lookup - only allow no argument version */
            if (expr->prsnnlf == 3)
                errsig(ctx->prscxerr, ERR_BADSPECEXPR);
            
            /* replace with data-only (no method call) version */
            expr->prsntyp = TOKTDOTSPEC;
            break;
            
        default:
            /* other expressions are acceptable */
            break;
        }
        
        /* go through all subnodes of this node */
        for (i = 0 ; i < expr->prsnnlf ; ++i)
            prs_check_spec(ctx, expr->prsnv.prsnvn[i]);
    }
}